

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O0

void parse_with_opts_should_handle_empty_strings(void)

{
  cJSON *pcVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *local_20;
  char *error_pointer;
  long lStack_10;
  char empty_string [1];
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  memset((void *)((long)&error_pointer + 7),0,1);
  local_20 = (char *)0x0;
  pcVar1 = cJSON_ParseWithOpts((char *)((long)&error_pointer + 7),(char **)0x0,0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x2c);
  }
  pcVar2 = cJSON_GetErrorPtr();
  UnityAssertEqualNumber
            ((long)&error_pointer + 7,(UNITY_INT)pcVar2,(char *)0x0,0x2d,UNITY_DISPLAY_STYLE_HEX64);
  pcVar1 = cJSON_ParseWithOpts((char *)((long)&error_pointer + 7),&local_20,0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x2f);
  }
  UnityAssertEqualNumber
            ((long)&error_pointer + 7,(UNITY_INT)local_20,(char *)0x0,0x30,UNITY_DISPLAY_STYLE_HEX64
            );
  pcVar2 = cJSON_GetErrorPtr();
  UnityAssertEqualNumber
            ((long)&error_pointer + 7,(UNITY_INT)pcVar2,(char *)0x0,0x31,UNITY_DISPLAY_STYLE_HEX64);
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void parse_with_opts_should_handle_empty_strings(void)
{
    const char empty_string[] = "";
    const char *error_pointer = NULL;

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(empty_string, NULL, false));
    TEST_ASSERT_EQUAL_PTR(empty_string, cJSON_GetErrorPtr());

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(empty_string, &error_pointer, false));
    TEST_ASSERT_EQUAL_PTR(empty_string, error_pointer);
    TEST_ASSERT_EQUAL_PTR(empty_string, cJSON_GetErrorPtr());
}